

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_TextObject *
ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject
          (ON_OBSOLETE_V2_TextObject *V2_text_object,ON_3dmAnnotationContext *annotation_context,
          ON_OBSOLETE_V5_TextObject *destination)

{
  double dVar1;
  bool bVar2;
  ON_3dmAnnotationSettings *this;
  ON_DimStyle *src;
  double local_5d0;
  double local_5c8;
  double local_5a8;
  double local_598;
  ON_OBSOLETE_V5_Annotation *local_580;
  ON_3dVector local_570;
  undefined1 auStack_558 [8];
  ON_Plane plane;
  double V2_to_V5_text_scale;
  double model_view_text_scale;
  double V2_dim_scale;
  double dim_style_dim_scale;
  ON_OBSOLETE_V5_TextObject *V5_text_object;
  undefined1 local_480 [7];
  bool bDimStyleIsSet;
  ON_DimStyle dim_style;
  bool bAnnotationSettingsAreSet;
  ON_3dmAnnotationSettings *annotation_settings;
  ON_OBSOLETE_V5_TextObject *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V2_TextObject *V2_text_object_local;
  
  destination_local = (ON_OBSOLETE_V5_TextObject *)annotation_context;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    destination_local = (ON_OBSOLETE_V5_TextObject *)&ON_3dmAnnotationContext::Default;
  }
  this = ON_3dmAnnotationContext::AnnotationSettings((ON_3dmAnnotationContext *)destination_local);
  dim_style.m_parent_dimstyle_managed_font._7_1_ =
       ON_3dmAnnotationContext::AnnotationSettingsAreSet
                 ((ON_3dmAnnotationContext *)destination_local);
  src = ON_3dmAnnotationContext::DimStyle((ON_3dmAnnotationContext *)destination_local);
  ON_DimStyle::ON_DimStyle((ON_DimStyle *)local_480,src);
  bVar2 = ON_3dmAnnotationContext::DimStyleIsSet((ON_3dmAnnotationContext *)destination_local);
  local_580 = &destination->super_ON_OBSOLETE_V5_Annotation;
  if (destination == (ON_OBSOLETE_V5_TextObject *)0x0) {
    local_580 = (ON_OBSOLETE_V5_Annotation *)operator_new(0xe0);
    ON_OBSOLETE_V5_TextObject((ON_OBSOLETE_V5_TextObject *)local_580);
  }
  ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
            (local_580,&V2_text_object->super_ON_OBSOLETE_V2_Annotation,
             (ON_3dmAnnotationContext *)destination_local);
  local_580->m_type = dtTextBlock;
  if (bVar2) {
    local_598 = ON_DimStyle::DimScale((ON_DimStyle *)local_480);
  }
  else {
    local_598 = 1.0;
  }
  if ((((dim_style.m_parent_dimstyle_managed_font._7_1_ & 1) == 0) ||
      (bVar2 = ON_IsValid(this->m_dimscale), !bVar2)) || (this->m_dimscale <= 0.0)) {
    local_5a8 = 1.0;
  }
  else {
    local_5a8 = this->m_dimscale;
  }
  if ((((dim_style.m_parent_dimstyle_managed_font._7_1_ & 1) == 0) ||
      (bVar2 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled(this), !bVar2)) ||
     (dVar1 = ON_3dmAnnotationSettings::WorldViewTextScale(this), dVar1 <= 0.0)) {
    local_5c8 = 1.0;
  }
  else {
    local_5c8 = ON_3dmAnnotationSettings::WorldViewTextScale(this);
  }
  if (((local_5c8 <= 0.0) || (local_5a8 <= 0.0)) || (local_598 <= 0.0)) {
    local_5d0 = 1.0;
  }
  else {
    local_5d0 = local_5c8 * (local_5a8 / local_598);
  }
  dVar1 = ON_OBSOLETE_V2_TextObject::Height(V2_text_object);
  ON_OBSOLETE_V5_Annotation::SetHeight(local_580,dVar1 * local_5d0);
  plane.plane_equation.y =
       (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.plane_equation.z;
  plane.plane_equation.z =
       (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.plane_equation.d;
  plane.zaxis.z = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.plane_equation.x;
  plane.plane_equation.x =
       (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.plane_equation.y;
  plane.zaxis.x = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.zaxis.y;
  plane.zaxis.y = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.zaxis.z;
  plane.yaxis.y = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.yaxis.z;
  plane.yaxis.z = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.zaxis.x;
  auStack_558 = (undefined1  [8])(V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.origin.x;
  plane.origin.x = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.origin.y;
  plane.origin.y = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.origin.z;
  plane.origin.z = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.xaxis.x;
  plane.xaxis.x = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.xaxis.y;
  plane.xaxis.y = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.xaxis.z;
  plane.xaxis.z = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.yaxis.x;
  plane.yaxis.x = (V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane.yaxis.y;
  dVar1 = ON_OBSOLETE_V2_TextObject::Height(V2_text_object);
  ::operator*(&local_570,dVar1 * local_5d0 * -1.11,(ON_3dVector *)&plane.xaxis.z);
  ON_3dPoint::operator+=((ON_3dPoint *)auStack_558,&local_570);
  ON_Plane::UpdateEquation((ON_Plane *)auStack_558);
  ON_OBSOLETE_V5_Annotation::SetPlane(local_580,(ON_Plane *)auStack_558);
  ON_Plane::~ON_Plane((ON_Plane *)auStack_558);
  ON_DimStyle::~ON_DimStyle((ON_DimStyle *)local_480);
  return (ON_OBSOLETE_V5_TextObject *)local_580;
}

Assistant:

ON_OBSOLETE_V5_TextObject* ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject(
  const class ON_OBSOLETE_V2_TextObject& V2_text_object,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_TextObject* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();
  const bool bAnnotationSettingsAreSet = annotation_context->AnnotationSettingsAreSet();

  const ON_DimStyle dim_style = annotation_context->DimStyle();
  const bool bDimStyleIsSet = annotation_context->DimStyleIsSet();

  ON_OBSOLETE_V5_TextObject* V5_text_object
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_TextObject();
  V5_text_object->Internal_InitializeFromV2Annotation(V2_text_object, annotation_context);
  V5_text_object->m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock;

  const double dim_style_dim_scale
    = bDimStyleIsSet
    ? dim_style.DimScale()
    : 1.0;

  const double V2_dim_scale
    = (bAnnotationSettingsAreSet && ON_IsValid(annotation_settings.m_dimscale) && annotation_settings.m_dimscale > 0.0)
    ? annotation_settings.m_dimscale
    : 1.0;

  //const double dim_scale
  //  = (dim_style_dim_scale != V2_dim_scale && dim_style_dim_scale > 0.0 && V2_dim_scale > 0.0)
  //  ? V2_dim_scale / dim_style_dim_scale
  //  : 1.0;

  const double model_view_text_scale
    = (bAnnotationSettingsAreSet && annotation_settings.Is_V5_AnnotationScalingEnabled() && annotation_settings.WorldViewTextScale() > 0.0)
    ? annotation_settings.WorldViewTextScale()
    : 1.0;

  const double V2_to_V5_text_scale
    = (model_view_text_scale > 0.0 && V2_dim_scale > 0.0 && dim_style_dim_scale > 0.0)
    ? model_view_text_scale*(V2_dim_scale / dim_style_dim_scale)
    : 1.0;


  V5_text_object->SetHeight(V2_text_object.Height()*V2_to_V5_text_scale);

  // Adjust from top-left justified to baseline-justified
  // 13 November 2006 Dale Lear
  //    The code that was here only worked for text entities
  //    in the x-y plane.
  //plane.origin.y += -1.11 * pT->Height() * plane.yaxis.y;
  //plane.origin.x += 1.11 * pT->Height() * plane.xaxis.y;

  // works for any plane
  ON_Plane plane = V2_text_object.m_plane;
  plane.origin += -1.11 * (V2_text_object.Height()*V2_to_V5_text_scale) * plane.yaxis;
  plane.UpdateEquation();
  V5_text_object->SetPlane(plane);


  return V5_text_object;

}